

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_map.cpp
# Opt level: O2

msecnode_t * P_AddSecnode(sector_t *s,AActor *thing,msecnode_t *nextnode,msecnode_t **sec_thinglist)

{
  msecnode_t *pmVar1;
  PClass *pPVar2;
  msecnode_t *pmVar3;
  
  pmVar3 = nextnode;
  if (s == (sector_t *)0x0) {
    pPVar2 = DObject::GetClass((DObject *)thing);
    I_FatalError("AddSecnode of 0 for %s\n",
                 FName::NameData.NameArray[(pPVar2->super_PStruct).super_PNamedType.TypeName.Index].
                 Text);
  }
  while( true ) {
    if (pmVar3 == (msecnode_t *)0x0) {
      pmVar3 = P_GetSecnode();
      pmVar3->visited = false;
      pmVar3->m_sector = s;
      pmVar3->m_thing = thing;
      pmVar3->m_tprev = (msecnode_t *)0x0;
      pmVar3->m_tnext = nextnode;
      if (nextnode != (msecnode_t *)0x0) {
        nextnode->m_tprev = pmVar3;
      }
      pmVar3->m_sprev = (msecnode_t *)0x0;
      pmVar1 = *sec_thinglist;
      pmVar3->m_snext = pmVar1;
      if (pmVar1 != (msecnode_t *)0x0) {
        pmVar1->m_sprev = pmVar3;
      }
      *sec_thinglist = pmVar3;
      return pmVar3;
    }
    if (pmVar3->m_sector == s) break;
    pmVar3 = pmVar3->m_tnext;
  }
  pmVar3->m_thing = thing;
  return nextnode;
}

Assistant:

msecnode_t *P_AddSecnode(sector_t *s, AActor *thing, msecnode_t *nextnode, msecnode_t *&sec_thinglist)
{
	msecnode_t *node;

	if (s == 0)
	{
		I_FatalError("AddSecnode of 0 for %s\n", thing->GetClass()->TypeName.GetChars());
	}

	node = nextnode;
	while (node)
	{
		if (node->m_sector == s)	// Already have a node for this sector?
		{
			node->m_thing = thing;	// Yes. Setting m_thing says 'keep it'.
			return nextnode;
		}
		node = node->m_tnext;
	}

	// Couldn't find an existing node for this sector. Add one at the head
	// of the list.

	node = P_GetSecnode();

	// killough 4/4/98, 4/7/98: mark new nodes unvisited.
	node->visited = 0;

	node->m_sector = s; 			// sector
	node->m_thing = thing; 		// mobj
	node->m_tprev = NULL;			// prev node on Thing thread
	node->m_tnext = nextnode;		// next node on Thing thread
	if (nextnode)
		nextnode->m_tprev = node;	// set back link on Thing

	// Add new node at head of sector thread starting at s->touching_thinglist

	node->m_sprev = NULL;			// prev node on sector thread
	node->m_snext = sec_thinglist; // next node on sector thread
	if (sec_thinglist)
		node->m_snext->m_sprev = node;
	sec_thinglist = node;
	return node;
}